

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minigzip.c
# Opt level: O3

void file_uncompress(char *file)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  int iVar4;
  char *pcVar5;
  gzFile pgVar6;
  FILE *pFVar7;
  char *pcVar8;
  char *in_RSI;
  char *pcVar9;
  gzFile unaff_R12;
  ulong uVar10;
  uint uVar11;
  char *unaff_R14;
  ulong uVar12;
  char *pcVar13;
  bool bVar14;
  char buf [1024];
  undefined4 uStack_470;
  undefined1 uStack_46c;
  char *pcStack_458;
  gzFile pgStack_450;
  ulong uStack_448;
  char *pcStack_440;
  char *pcStack_438;
  char acStack_428 [1024];
  
  pcVar13 = acStack_428;
  pcVar5 = (char *)strlen(file);
  uVar10 = (ulong)pcVar5 & 0xffffffff;
  if (uVar10 < 0x3fd) {
    unaff_R12 = (gzFile)0x400;
    snprintf(acStack_428,0x400,"%s",file);
    if (((uint)pcVar5 < 4) || (iVar3 = strcmp(file + (uVar10 - 3),".gz"), iVar3 != 0)) {
      unaff_R12 = (gzFile)(0x400 - uVar10);
      snprintf(acStack_428 + uVar10,(size_t)unaff_R12,"%s",".gz");
      unaff_R14 = acStack_428;
      pcVar13 = file;
    }
    else {
      acStack_428[(uint)pcVar5 - 3] = '\0';
      unaff_R14 = file;
    }
    in_RSI = "rb";
    pgVar6 = (gzFile)gzopen64(unaff_R14);
    pcVar5 = pcVar13;
    if (pgVar6 == (gzFile)0x0) goto LAB_001017f3;
    in_RSI = "wb";
    pFVar7 = fopen64(pcVar13,"wb");
    if (pFVar7 != (FILE *)0x0) {
      gz_uncompress(pgVar6,(FILE *)pFVar7);
      unlink(unaff_R14);
      return;
    }
  }
  else {
    file_uncompress_cold_3();
LAB_001017f3:
    pgVar6 = unaff_R12;
    file_uncompress_cold_2();
  }
  pcVar9 = file;
  file_uncompress_cold_1();
  uVar12 = (ulong)pcVar9 & 0xffffffff;
  uStack_46c = 0;
  uStack_470 = 0x20366277;
  pcVar13 = *(char **)in_RSI;
  prog = pcVar13;
  pcStack_458 = file;
  pgStack_450 = pgVar6;
  uStack_448 = uVar10;
  pcStack_440 = unaff_R14;
  pcStack_438 = pcVar5;
  pcVar8 = strrchr(pcVar13,0x2f);
  pcVar5 = pcVar8 + 1;
  if (pcVar8 == (char *)0x0) {
    pcVar5 = pcVar13;
  }
  iVar3 = strcmp(pcVar5,"gunzip");
  if (iVar3 == 0) {
    bVar14 = true;
    bVar1 = false;
  }
  else {
    iVar3 = strcmp(pcVar5,"zcat");
    bVar14 = iVar3 == 0;
    bVar1 = bVar14;
  }
  in_RSI = in_RSI + 8;
  iVar3 = (int)pcVar9 + -1;
  if ((int)pcVar9 < 2) {
LAB_0010193b:
    uStack_470 = uStack_470 & 0xffffff;
  }
  else {
    cVar2 = ' ';
    do {
      pcVar13 = *(char **)in_RSI;
      if (*pcVar13 != '-') goto LAB_00101937;
      if ((pcVar13[1] == 'c') && (pcVar13[2] == '\0')) {
        bVar1 = true;
      }
      else if ((pcVar13[1] == 'd') && (pcVar13[2] == '\0')) {
        bVar14 = true;
      }
      else if ((pcVar13[1] == 'f') && (pcVar13[2] == '\0')) {
        uStack_470 = CONCAT13(0x66,(undefined3)uStack_470);
        cVar2 = 'f';
      }
      else if ((pcVar13[1] == 'h') && (pcVar13[2] == '\0')) {
        uStack_470 = CONCAT13(0x68,(undefined3)uStack_470);
        cVar2 = 'h';
      }
      else if ((pcVar13[1] == 'r') && (pcVar13[2] == '\0')) {
        uStack_470 = CONCAT13(0x52,(undefined3)uStack_470);
        cVar2 = 'R';
      }
      else {
        if (8 < (byte)(pcVar13[1] - 0x31U)) goto LAB_00101937;
        if (pcVar13[2] != '\0') {
          iVar3 = (int)uVar12 + -1;
          goto LAB_00101937;
        }
        uStack_470._0_3_ = CONCAT12(pcVar13[1],(undefined2)uStack_470);
      }
      in_RSI = in_RSI + 8;
      iVar3 = iVar3 + -1;
      uVar11 = (int)uVar12 - 1;
      uVar12 = (ulong)uVar11;
    } while (1 < (int)uVar11);
    iVar3 = 0;
LAB_00101937:
    if (cVar2 == ' ') goto LAB_0010193b;
  }
  if (iVar3 == 0) {
    if (bVar14) {
      iVar3 = fileno(_stdin);
      pgVar6 = (gzFile)gzdopen(iVar3,"rb");
      if (pgVar6 == (gzFile)0x0) {
LAB_00101a73:
        main_cold_3();
LAB_00101a78:
        main_cold_4();
        halt_baddata();
      }
      gz_uncompress(pgVar6,(FILE *)_stdout);
    }
    else {
      iVar3 = fileno(_stdout);
      pgVar6 = (gzFile)gzdopen(iVar3,&uStack_470);
      if (pgVar6 == (gzFile)0x0) goto LAB_00101a78;
      gz_compress((FILE *)_stdin,pgVar6);
    }
  }
  else {
    do {
      pcVar13 = *(char **)in_RSI;
      if (bVar14) {
        if (bVar1) {
          pgVar6 = (gzFile)gzopen64(pcVar13,"rb");
          if (pgVar6 == (gzFile)0x0) {
            main_cold_1();
          }
          else {
            gz_uncompress(pgVar6,(FILE *)_stdout);
          }
        }
        else {
          file_uncompress(pcVar13);
        }
      }
      else if (bVar1) {
        pFVar7 = fopen64(pcVar13,"rb");
        if (pFVar7 == (FILE *)0x0) {
          perror(*(char **)in_RSI);
        }
        else {
          iVar4 = fileno(_stdout);
          pgVar6 = (gzFile)gzdopen(iVar4,&uStack_470);
          if (pgVar6 == (gzFile)0x0) {
            main_cold_2();
            goto LAB_00101a73;
          }
          gz_compress((FILE *)pFVar7,pgVar6);
        }
      }
      else {
        file_compress(pcVar13,(char *)&uStack_470);
      }
      in_RSI = in_RSI + 8;
      iVar3 = iVar3 + -1;
    } while (iVar3 != 0);
  }
  return;
}

Assistant:

void file_uncompress(file)
    char  *file;
{
    local char buf[MAX_NAME_LEN];
    char *infile, *outfile;
    FILE  *out;
    gzFile in;
    unsigned len = strlen(file);

    if (len + strlen(GZ_SUFFIX) >= sizeof(buf)) {
        fprintf(stderr, "%s: filename too long\n", prog);
        exit(1);
    }

#if !defined(NO_snprintf) && !defined(NO_vsnprintf)
    snprintf(buf, sizeof(buf), "%s", file);
#else
    strcpy(buf, file);
#endif

    if (len > SUFFIX_LEN && strcmp(file+len-SUFFIX_LEN, GZ_SUFFIX) == 0) {
        infile = file;
        outfile = buf;
        outfile[len-3] = '\0';
    } else {
        outfile = file;
        infile = buf;
#if !defined(NO_snprintf) && !defined(NO_vsnprintf)
        snprintf(buf + len, sizeof(buf) - len, "%s", GZ_SUFFIX);
#else
        strcat(infile, GZ_SUFFIX);
#endif
    }
    in = gzopen(infile, "rb");
    if (in == NULL) {
        fprintf(stderr, "%s: can't gzopen %s\n", prog, infile);
        exit(1);
    }
    out = fopen(outfile, "wb");
    if (out == NULL) {
        perror(file);
        exit(1);
    }

    gz_uncompress(in, out);

    unlink(infile);
}